

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node_set * __thiscall
pugi::xpath_query::evaluate_node_set
          (xpath_node_set *__return_storage_ptr__,xpath_query *this,xpath_node *n)

{
  type_t type_;
  xpath_ast_node *this_00;
  bad_alloc *this_01;
  xpath_node *begin_;
  xpath_node *end_;
  undefined1 local_20d0 [8];
  xpath_node_set_raw r;
  xpath_stack_data sd;
  xpath_context c;
  xpath_ast_node *root;
  xpath_node *n_local;
  xpath_query *this_local;
  
  this_00 = impl::anon_unknown_0::evaluate_node_set_prepare((xpath_query_impl *)this->_impl);
  if (this_00 == (xpath_ast_node *)0x0) {
    xpath_node_set::xpath_node_set(__return_storage_ptr__);
  }
  else {
    impl::anon_unknown_0::xpath_context::xpath_context((xpath_context *)&sd.oom,n,1,1);
    impl::anon_unknown_0::xpath_stack_data::xpath_stack_data((xpath_stack_data *)&r._eos);
    impl::anon_unknown_0::xpath_ast_node::eval_node_set
              ((xpath_node_set_raw *)local_20d0,this_00,(xpath_context *)&sd.oom,
               (xpath_stack *)&sd.temp._error,nodeset_eval_all);
    if (((byte)sd.stack.temp & 1) != 0) {
      this_01 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_01);
      __cxa_throw(this_01,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    begin_ = impl::anon_unknown_0::xpath_node_set_raw::begin((xpath_node_set_raw *)local_20d0);
    end_ = impl::anon_unknown_0::xpath_node_set_raw::end((xpath_node_set_raw *)local_20d0);
    type_ = impl::anon_unknown_0::xpath_node_set_raw::type((xpath_node_set_raw *)local_20d0);
    xpath_node_set::xpath_node_set(__return_storage_ptr__,begin_,end_,type_);
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data((xpath_stack_data *)&r._eos);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xpath_node_set xpath_query::evaluate_node_set(const xpath_node& n) const
	{
		impl::xpath_ast_node* root = impl::evaluate_node_set_prepare(static_cast<impl::xpath_query_impl*>(_impl));
		if (!root) return xpath_node_set();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_node_set_raw r = root->eval_node_set(c, sd.stack, impl::nodeset_eval_all);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return xpath_node_set();
		#else
			throw std::bad_alloc();
		#endif
		}

		return xpath_node_set(r.begin(), r.end(), r.type());
	}